

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidatePushCData(xmlValidCtxtPtr ctxt,xmlChar *data,int len)

{
  xmlValidState *pxVar1;
  int local_3c;
  int i;
  xmlElementPtr elemDecl;
  xmlValidStatePtr state;
  int ret;
  int len_local;
  xmlChar *data_local;
  xmlValidCtxtPtr ctxt_local;
  
  state._0_4_ = 1;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if (len < 1) {
    ctxt_local._4_4_ = 1;
  }
  else {
    if (((0 < ctxt->vstateNr) && (ctxt->vstate != (xmlValidState *)0x0)) &&
       (pxVar1 = ctxt->vstate, pxVar1->elemDecl != (xmlElementPtr)0x0)) {
      switch(pxVar1->elemDecl->etype) {
      case XML_ELEMENT_TYPE_UNDEFINED:
        state._0_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_EMPTY:
        xmlErrValidNode(ctxt,pxVar1->node,XML_DTD_NOT_EMPTY,
                        "Element %s was declared EMPTY this one has content\n",pxVar1->node->name,
                        (xmlChar *)0x0,(xmlChar *)0x0);
        state._0_4_ = 0;
        break;
      case XML_ELEMENT_TYPE_ANY:
        break;
      case XML_ELEMENT_TYPE_MIXED:
        break;
      case XML_ELEMENT_TYPE_ELEMENT:
        for (local_3c = 0; local_3c < len; local_3c = local_3c + 1) {
          if (((data[local_3c] != ' ') && ((data[local_3c] < 9 || (10 < data[local_3c])))) &&
             (data[local_3c] != '\r')) {
            xmlErrValidNode(ctxt,pxVar1->node,XML_DTD_CONTENT_MODEL,
                            "Element %s content does not follow the DTD, Text not allowed\n",
                            pxVar1->node->name,(xmlChar *)0x0,(xmlChar *)0x0);
            state._0_4_ = 0;
            break;
          }
        }
      }
    }
    ctxt_local._4_4_ = (int)state;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidatePushCData(xmlValidCtxtPtr ctxt, const xmlChar *data, int len) {
    int ret = 1;

/* printf("CDATA %s %d\n", data, len); */
    if (ctxt == NULL)
        return(0);
    if (len <= 0)
	return(ret);
    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    break;
		case XML_ELEMENT_TYPE_ELEMENT: {
                    int i;

                    for (i = 0;i < len;i++) {
                        if (!IS_BLANK_CH(data[i])) {
                            xmlErrValidNode(ctxt, state->node,
                                            XML_DTD_CONTENT_MODEL,
       "Element %s content does not follow the DTD, Text not allowed\n",
                                   state->node->name, NULL, NULL);
                            ret = 0;
                            goto done;
                        }
                    }
                    /*
                     * TODO:
                     * VC: Standalone Document Declaration
                     *  element types with element content, if white space
                     *  occurs directly within any instance of those types.
                     */
                    break;
                }
	    }
	}
    }
done:
    return(ret);
}